

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

void __thiscall
dg::vr::GraphBuilder::buildSwitch(GraphBuilder *this,SwitchInst *swtch,VRLocation *last)

{
  undefined8 uVar1;
  undefined8 uVar2;
  mapped_type pVVar3;
  uint uVar4;
  VRLocation *this_00;
  sockaddr *psVar5;
  long lVar6;
  mapped_type *ppVVar7;
  socklen_t __len;
  SwitchInst *pSVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  key_type local_48;
  undefined **local_40;
  GraphBuilder *local_38;
  
  uVar4 = *(uint *)(swtch + 0x14);
  uVar11 = (uVar4 >> 1 & 0x3ffffff) - 1;
  if (uVar11 != 0) {
    local_38 = this + 0x10;
    lVar12 = 0;
    local_40 = &PTR__VROp_00136d40;
    do {
      this_00 = VRCodeGraph::newVRLocation(*(VRCodeGraph **)(this + 8));
      psVar5 = (sockaddr *)operator_new(0x20);
      if ((*(uint *)(swtch + 0x14) >> 0x1e & 1) == 0) {
        pSVar8 = swtch + -(ulong)(*(uint *)(swtch + 0x14) << 5);
      }
      else {
        pSVar8 = *(SwitchInst **)(swtch + -8);
      }
      uVar1 = *(undefined8 *)pSVar8;
      uVar2 = *(undefined8 *)(pSVar8 + (ulong)((int)lVar12 + 2) * 0x20);
      psVar5->sa_data[6] = '\x03';
      psVar5->sa_data[7] = '\0';
      psVar5->sa_data[8] = '\0';
      psVar5->sa_data[9] = '\0';
      psVar5[1].sa_family = (short)uVar1;
      psVar5[1].sa_data[0] = (char)((ulong)uVar1 >> 0x10);
      psVar5[1].sa_data[1] = (char)((ulong)uVar1 >> 0x18);
      psVar5[1].sa_data[2] = (char)((ulong)uVar1 >> 0x20);
      psVar5[1].sa_data[3] = (char)((ulong)uVar1 >> 0x28);
      psVar5[1].sa_data[4] = (char)((ulong)uVar1 >> 0x30);
      psVar5[1].sa_data[5] = (char)((ulong)uVar1 >> 0x38);
      *(undefined ***)psVar5 = local_40;
      *(undefined8 *)(psVar5[1].sa_data + 6) = uVar2;
      VRLocation::connect(last,(int)this_00,psVar5,(socklen_t)uVar2);
      if ((*(uint *)(swtch + 0x14) >> 0x1e & 1) == 0) {
        lVar6 = (long)swtch - (ulong)(*(uint *)(swtch + 0x14) << 5);
      }
      else {
        lVar6 = *(long *)(swtch + -8);
      }
      uVar9 = (ulong)((int)lVar12 + 3);
      if (lVar12 == 0x1fffffffc) {
        uVar9 = 1;
      }
      lVar10 = uVar9 * 0x20;
      local_48 = *(key_type *)(lVar6 + lVar10);
      ppVVar7 = std::
                map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                              *)local_38,&local_48);
      __len = (socklen_t)lVar10;
      pVVar3 = *ppVVar7;
      psVar5 = (sockaddr *)operator_new(0x10);
      psVar5->sa_data[6] = '\0';
      psVar5->sa_data[7] = '\0';
      psVar5->sa_data[8] = '\0';
      psVar5->sa_data[9] = '\0';
      *(undefined ***)psVar5 = &PTR__VROp_00136d00;
      VRLocation::connect(this_00,(int)pVVar3,psVar5,__len);
      lVar12 = lVar12 + 2;
    } while ((ulong)uVar11 * 2 != lVar12);
    uVar4 = *(uint *)(swtch + 0x14);
  }
  if ((uVar4 >> 0x1e & 1) == 0) {
    lVar12 = (long)swtch - (ulong)(uVar4 << 5);
  }
  else {
    lVar12 = *(long *)(swtch + -8);
  }
  local_48 = *(key_type *)(lVar12 + 0x20);
  ppVVar7 = std::
            map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
            ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                          *)(this + 0x10),&local_48);
  pVVar3 = *ppVVar7;
  psVar5 = (sockaddr *)operator_new(0x10);
  psVar5->sa_data[6] = '\0';
  psVar5->sa_data[7] = '\0';
  psVar5->sa_data[8] = '\0';
  psVar5->sa_data[9] = '\0';
  *(undefined ***)psVar5 = &PTR__VROp_00136d00;
  VRLocation::connect(last,(int)pVVar3,psVar5,0x136d00);
  return;
}

Assistant:

void GraphBuilder::buildSwitch(const llvm::SwitchInst *swtch,
                               VRLocation &last) {
    for (auto &it : swtch->cases()) {
        VRLocation &padding = codeGraph.newVRLocation();

        last.connect(padding, new VRAssumeEqual(swtch->getCondition(),
                                                it.getCaseValue()));

        assert(fronts.find(it.getCaseSuccessor()) != fronts.end());
        VRLocation &first = *fronts[it.getCaseSuccessor()];

        padding.connect(first, new VRNoop());
    }

    assert(fronts.find(swtch->getDefaultDest()) != fronts.end());
    VRLocation &first = *fronts[swtch->getDefaultDest()];
    last.connect(first, new VRNoop());
}